

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task19.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  long *plVar2;
  int i;
  long lVar3;
  int iVar4;
  int num;
  int n;
  int all_nums [10];
  int local_60;
  int local_5c;
  int local_58 [12];
  
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  std::istream::operator>>((istream *)&std::cin,&local_5c);
  if (0 < local_5c) {
    iVar4 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_60);
      local_58[local_60] = local_58[local_60] + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_5c);
  }
  lVar3 = 0;
  do {
    iVar4 = local_58[lVar3];
    if (iVar4 != 0) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar3);
      local_60 = CONCAT31(local_60._1_3_,0x3a);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
      plVar2 = (long *)std::ostream::operator<<(poVar1,iVar4);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  return 0;
}

Assistant:

int main(){
    int n;
    int all_nums[10] = {};
    cin >> n;
    for (int i =0; i <n; i++){
        int num;
        cin >> num;
        all_nums[num] ++;
    }
    for (int i = 0; i < 10; i++) if (all_nums[i]) cout << i << ':' << all_nums[i] << endl;
    return 0;
}